

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

size_t __thiscall
ot::commissioner::CommissionerApp::EraseAllJoiners(CommissionerApp *this,JoinerType aJoinerType)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  iterator joiner;
  size_t count;
  JoinerType aJoinerType_local;
  CommissionerApp *this_local;
  
  joiner._M_node = (_Base_ptr)0x0;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
       ::begin(&this->mJoiners);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
         ::end(&this->mJoiners);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>
             ::operator->(&local_28);
    if ((ppVar2->first).mType == aJoinerType) {
      joiner._M_node = (_Base_ptr)((long)&(joiner._M_node)->_M_color + 1);
      local_28._M_node =
           (_Base_ptr)
           std::
           map<ot::commissioner::CommissionerApp::JoinerKey,ot::commissioner::JoinerInfo,std::less<ot::commissioner::CommissionerApp::JoinerKey>,std::allocator<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>>
           ::erase_abi_cxx11_((map<ot::commissioner::CommissionerApp::JoinerKey,ot::commissioner::JoinerInfo,std::less<ot::commissioner::CommissionerApp::JoinerKey>,std::allocator<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>>
                               *)&this->mJoiners,local_28._M_node);
    }
    else {
      std::
      _Rb_tree_iterator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>
      ::operator++(&local_28);
    }
  }
  return (size_t)joiner._M_node;
}

Assistant:

size_t CommissionerApp::EraseAllJoiners(JoinerType aJoinerType)
{
    size_t count  = 0;
    auto   joiner = mJoiners.begin();
    while (joiner != mJoiners.end())
    {
        if (joiner->first.mType == aJoinerType)
        {
            ++count;
            joiner = mJoiners.erase(joiner);
        }
        else
        {
            ++joiner;
        }
    }
    return count;
}